

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O2

int run_test_pipe_set_non_blocking(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_6;
  int64_t eval_a_6;
  uv_os_fd_t fd [2];
  uv_buf_t buf;
  thread_ctx ctx;
  uv_thread_t thread;
  uv_pipe_t pipe_handle;
  char data [4096];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
  data._0_8_ = SEXT48(iVar1);
  ctx.barrier.__align = 0;
  if (data._0_8_ == 0) {
    iVar1 = uv_pipe(fd,0,0);
    data._0_8_ = SEXT48(iVar1);
    ctx.barrier.__align = 0;
    if (data._0_8_ != 0) {
      pcVar4 = "uv_pipe(fd, 0, 0)";
      uVar2 = 0x51;
      goto LAB_001648f2;
    }
    iVar1 = uv_pipe_open(&pipe_handle,fd[1]);
    data._0_8_ = SEXT48(iVar1);
    ctx.barrier.__align = 0;
    if (data._0_8_ != 0) {
      pcVar4 = "uv_pipe_open(&pipe_handle, fd[1])";
      uVar2 = 0x52;
      goto LAB_001648f2;
    }
    iVar1 = uv_stream_set_blocking(&pipe_handle,1);
    data._0_8_ = SEXT48(iVar1);
    ctx.barrier.__align = 0;
    if (data._0_8_ != 0) {
      pcVar4 = "uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1)";
      uVar2 = 0x53;
      goto LAB_001648f2;
    }
    fd[1] = -1;
    ctx.fd = fd[0];
    iVar1 = uv_barrier_init(&ctx,2);
    data._0_8_ = SEXT48(iVar1);
    buf.base = (char *)0x0;
    if (data._0_8_ == 0) {
      iVar1 = uv_thread_create(&thread,thread_main,&ctx);
      data._0_8_ = SEXT48(iVar1);
      buf.base = (char *)0x0;
      if (data._0_8_ == 0) {
        uv_barrier_wait(&ctx);
        buf.len = 0x1000;
        buf.base = data;
        memset(buf.base,0x2e,0x1000);
        for (pcVar4 = (char *)0x0; pcVar4 < ::data + 0x6c6d80; pcVar4 = pcVar4 + 0x1000) {
          iVar1 = uv_try_write(&pipe_handle,&buf,1);
          eval_a_6 = (int64_t)iVar1;
          eval_b_6 = 0x1000;
          if (eval_a_6 != 0x1000) {
            pcVar3 = "sizeof(data)";
            pcVar4 = "n";
            uVar2 = 0x76;
            goto LAB_0016481d;
          }
        }
        uv_close(&pipe_handle,0);
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        eval_a_6 = (int64_t)iVar1;
        eval_b_6 = 0;
        if (eval_a_6 == 0) {
          iVar1 = uv_thread_join(&thread);
          eval_a_6 = (int64_t)iVar1;
          eval_b_6 = 0;
          if (eval_a_6 == 0) {
            iVar1 = close(fd[0]);
            eval_a_6 = (int64_t)iVar1;
            eval_b_6 = 0;
            if (eval_a_6 == 0) {
              fd[0] = -1;
              uv_barrier_destroy(&ctx);
              uVar2 = uv_default_loop();
              uv_walk(uVar2,close_walk_cb,0);
              uv_run(uVar2,0);
              eval_a_6 = 0;
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              eval_b_6 = (int64_t)iVar1;
              if (eval_b_6 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "uv_loop_close(uv_default_loop())";
              pcVar4 = "0";
              uVar2 = 0x87;
            }
            else {
              pcVar3 = "0";
              pcVar4 = "close(fd[0])";
              uVar2 = 0x82;
            }
          }
          else {
            pcVar3 = "0";
            pcVar4 = "uv_thread_join(&thread)";
            uVar2 = 0x7d;
          }
        }
        else {
          pcVar3 = "0";
          pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar2 = 0x7b;
        }
        goto LAB_0016481d;
      }
      pcVar4 = "uv_thread_create(&thread, thread_main, &ctx)";
      uVar2 = 0x5d;
    }
    else {
      pcVar4 = "uv_barrier_init(&ctx.barrier, 2)";
      uVar2 = 0x5c;
    }
    buf.base = (char *)0x0;
  }
  else {
    pcVar4 = "uv_pipe_init(uv_default_loop(), &pipe_handle, 0)";
    uVar2 = 0x50;
LAB_001648f2:
    ctx.barrier.__align = 0;
  }
  eval_b_6 = 0;
  pcVar3 = "0";
  eval_a_6 = data._0_8_;
LAB_0016481d:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-non-blocking.c"
          ,uVar2,pcVar4,"==",pcVar3,eval_a_6,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  uv_os_fd_t fd[2];
  int n;
#ifdef _WIN32
  uv_write_t write_req;
#endif

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe(fd, 0, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[1]));
  ASSERT_OK(uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));
  /* fd[1] is owned by pipe_handle now. */
#ifdef _WIN32
  fd[1] = INVALID_HANDLE_VALUE;
#else
  fd[1] = -1;
#endif

  ctx.fd = fd[0];
  ASSERT_OK(uv_barrier_init(&ctx.barrier, 2));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < NWRITES) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
#ifdef _WIN32
    ASSERT_EQ(n, UV_EAGAIN); /* E_NOTIMPL */
    ASSERT_OK(uv_write(&write_req,
                       (uv_stream_t*) &pipe_handle,
                       &buf,
                       1,
                       write_cb));
    ASSERT_NOT_NULL(write_req.handle);
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT_NULL(write_req.handle); /* check for signaled completion of write_cb */
    n = buf.len;
#endif
    ASSERT_EQ(n, sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_thread_join(&thread));
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[0]));  /* fd[1] is closed by uv_close(). */
  fd[0] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[0]));  /* fd[1] is closed by uv_close(). */
  fd[0] = -1;
#endif
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}